

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O1

int Saig_ManRetimeUnsatCore(Aig_Man_t *p,int fVerbose)

{
  int **ppiVar1;
  int *piVar2;
  int iVar3;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Sto_Man_t *pCnf;
  Intp_Man_t *p_01;
  void *__ptr;
  void *__s;
  long lVar4;
  ulong uVar5;
  long lVar6;
  size_t __size;
  long lVar7;
  int *piVar8;
  long lVar9;
  uint uVar10;
  
  p_00 = Cnf_DeriveSimpleForRetiming(p);
  s = sat_solver_new();
  sat_solver_store_alloc(s);
  sat_solver_setnvars(s,p_00->nVars);
  lVar7 = 0;
  while (lVar7 < p_00->nClauses) {
    iVar3 = sat_solver_addclause(s,p_00->pClauses[lVar7],p_00->pClauses[lVar7 + 1]);
    lVar7 = lVar7 + 1;
    if (iVar3 == 0) {
      Cnf_DataFree(p_00);
      sat_solver_delete(s);
      return -1;
    }
  }
  sat_solver_store_mark_roots(s);
  uVar10 = 0;
  iVar3 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,1000000,0,0,0);
  if (iVar3 == -1) {
    pCnf = (Sto_Man_t *)sat_solver_store_release(s);
    sat_solver_delete(s);
    p_01 = Intp_ManAlloc();
    __ptr = Intp_ManUnsatCore(p_01,pCnf,0,0);
    Intp_ManFree(p_01);
    Sto_ManFree(pCnf);
    __size = (long)p_00->nVars << 2;
    __s = malloc(__size);
    memset(__s,0,__size);
    lVar7 = (long)*(int *)((long)__ptr + 4);
    if (0 < lVar7) {
      lVar4 = *(long *)((long)__ptr + 8);
      ppiVar1 = p_00->pClauses;
      lVar6 = 0;
      uVar10 = 0;
      do {
        lVar9 = (long)*(int *)(lVar4 + lVar6 * 4);
        piVar2 = ppiVar1[lVar9 + 1];
        for (piVar8 = ppiVar1[lVar9]; piVar8 < piVar2; piVar8 = piVar8 + 1) {
          uVar10 = uVar10 + (*(int *)((long)__s + (long)(*piVar8 >> 1) * 4) == 0);
          *(undefined4 *)((long)__s + (long)(*piVar8 >> 1) * 4) = 1;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != lVar7);
    }
    lVar4 = (long)p->vCos->nSize;
    if (lVar4 < 1) {
      uVar5 = 0;
      iVar3 = -1;
    }
    else {
      iVar3 = -1;
      lVar6 = 0;
      uVar5 = 0;
      do {
        if ((-1 < (long)p_00->pVarNums[*(int *)((long)p->vCos->pArray[lVar6] + 0x24)]) &&
           (*(int *)((long)__s +
                    (long)p_00->pVarNums[*(int *)((long)p->vCos->pArray[lVar6] + 0x24)] * 4) == 1))
        {
          if (iVar3 == -1) {
            iVar3 = (int)lVar6;
          }
          uVar5 = (ulong)((int)uVar5 + 1);
        }
        lVar6 = lVar6 + 1;
      } while (lVar4 != lVar6);
    }
    if (fVerbose != 0) {
      printf("UNSAT core: %d clauses, %d variables, %d POs.  ",lVar7,(ulong)uVar10,uVar5);
    }
    if (__s != (void *)0x0) {
      free(__s);
    }
    if (*(void **)((long)__ptr + 8) != (void *)0x0) {
      free(*(void **)((long)__ptr + 8));
      *(undefined8 *)((long)__ptr + 8) = 0;
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    Cnf_DataFree(p_00);
    return iVar3;
  }
  if (iVar3 == 0) {
    __assert_fail("RetValue != l_Undef",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetMin.c"
                  ,0x7d,"int Saig_ManRetimeUnsatCore(Aig_Man_t *, int)");
  }
  __assert_fail("RetValue == l_False",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetMin.c"
                ,0x7e,"int Saig_ManRetimeUnsatCore(Aig_Man_t *, int)");
}

Assistant:

int Saig_ManRetimeUnsatCore( Aig_Man_t * p, int fVerbose )
{
    int fVeryVerbose = 0;
    int nConfLimit = 1000000;
    void * pSatCnf = NULL; 
    Intp_Man_t * pManProof;
    Vec_Int_t * vCore = NULL;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    int * pClause1, * pClause2, * pLit, * pVars;
    int i, RetValue, iBadPo, iClause, nVars, nPos;
    // create the SAT solver
    pCnf = Cnf_DeriveSimpleForRetiming( p );
    pSat = sat_solver_new();
    sat_solver_store_alloc( pSat ); 
    sat_solver_setnvars( pSat, pCnf->nVars );
    for ( i = 0; i < pCnf->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
        {
            Cnf_DataFree( pCnf );
            sat_solver_delete( pSat );
            return -1;
        }
    }
    sat_solver_store_mark_roots( pSat ); 
    // solve the problem
    RetValue = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    assert( RetValue != l_Undef );
    assert( RetValue == l_False );
    pSatCnf = sat_solver_store_release( pSat ); 
    sat_solver_delete( pSat );
    // derive the UNSAT core
    pManProof = Intp_ManAlloc();
    vCore = (Vec_Int_t *)Intp_ManUnsatCore( pManProof, (Sto_Man_t *)pSatCnf, 0, fVeryVerbose );
    Intp_ManFree( pManProof );
    Sto_ManFree( (Sto_Man_t *)pSatCnf );
    // derive the set of variables on which the core depends
    // collect the variable numbers
    nVars = 0;
    pVars = ABC_ALLOC( int, pCnf->nVars );
    memset( pVars, 0, sizeof(int) * pCnf->nVars );
    Vec_IntForEachEntry( vCore, iClause, i )
    {
        pClause1 = pCnf->pClauses[iClause];
        pClause2 = pCnf->pClauses[iClause+1];
        for ( pLit = pClause1; pLit < pClause2; pLit++ )
        {
            if ( pVars[ (*pLit) >> 1 ] == 0 )
                nVars++;
            pVars[ (*pLit) >> 1 ] = 1;
            if ( fVeryVerbose )
            printf( "%s%d ", ((*pLit) & 1)? "-" : "+", (*pLit) >> 1 );
        }
        if ( fVeryVerbose )
        printf( "\n" );
    }
    // collect the nodes
    if ( fVeryVerbose ) {
      Aig_ManForEachObj( p, pObj, i )
          if ( pCnf->pVarNums[pObj->Id] >= 0 && pVars[ pCnf->pVarNums[pObj->Id] ] == 1 )
          {
              Aig_ObjPrint( p, pObj );
              printf( "\n" );
          }
    }
    // pick the first PO in the list
    nPos = 0;
    iBadPo = -1;
    Aig_ManForEachCo( p, pObj, i )
        if ( pCnf->pVarNums[pObj->Id] >= 0 && pVars[ pCnf->pVarNums[pObj->Id] ] == 1 )
        {
            if ( iBadPo == -1 )
                iBadPo = i;
            nPos++;
        }
    if ( fVerbose )
        printf( "UNSAT core: %d clauses, %d variables, %d POs.  ", Vec_IntSize(vCore), nVars, nPos );
    ABC_FREE( pVars );
    Vec_IntFree( vCore );
    Cnf_DataFree( pCnf );
    return iBadPo;
}